

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  int *piVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  reference pvVar7;
  size_type sVar8;
  byte *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  long *in_RSI;
  void *in_R8;
  int bottom_blob_index_2;
  size_t i_3;
  int top_blob_index_2;
  size_t i_2;
  int ret_3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  int top_blob_index_1;
  size_t i_1;
  int ret_2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs;
  Mat *bottom_blob_ref_1;
  int bottom_blob_index_1;
  size_t i;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int ret_1;
  Mat top_blob;
  int ret;
  Mat *bottom_top_blob;
  Mat bottom_blob;
  Mat *bottom_blob_ref;
  int top_blob_index;
  int bottom_blob_index;
  reference in_stack_fffffffffffff970;
  size_type in_stack_fffffffffffff978;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff980;
  ulong local_528;
  ulong local_518;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  Layer *in_stack_fffffffffffffaf8;
  Mat *in_stack_fffffffffffffb00;
  NetPrivate *in_stack_fffffffffffffb08;
  ulong local_4e8;
  Mat local_4d0;
  reference local_488;
  int local_47c;
  int *local_478;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_468;
  int local_44c;
  value_type local_448;
  int local_400;
  int local_3fc;
  reference local_3f8;
  Mat local_3e0;
  value_type local_398;
  reference local_350;
  value_type local_348;
  int local_344;
  byte *local_340;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_338;
  long *local_330;
  int local_31c;
  value_type *local_318;
  value_type *local_310;
  int local_308;
  undefined4 local_304;
  reference local_300;
  reference local_2f8;
  reference local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  reference local_2e0;
  reference local_2d8;
  reference local_2d0;
  int local_2c8;
  undefined4 local_2c4;
  reference local_2c0;
  reference local_2b8;
  reference local_2b0;
  int local_2a8;
  undefined4 local_2a4;
  reference local_2a0;
  reference local_298;
  reference local_290;
  int local_288;
  undefined4 local_284;
  reference local_280;
  reference local_278;
  reference local_270;
  int local_268;
  undefined4 local_264;
  reference local_260;
  reference local_258;
  reference local_250;
  int local_248;
  undefined4 local_244;
  reference local_240;
  reference local_238;
  reference local_230;
  int local_228;
  undefined4 local_224;
  value_type *local_220;
  value_type *local_218;
  value_type *local_210;
  Mat *local_208;
  value_type *local_1f8;
  value_type *local_1e8;
  Mat *local_1d8;
  int local_1b8;
  undefined4 local_1b4;
  Mat *local_1b0;
  int local_198;
  undefined4 local_194;
  value_type *local_190;
  int local_178;
  undefined4 local_174;
  value_type *local_170;
  int local_158;
  undefined4 local_154;
  Mat *local_150;
  int local_148;
  undefined4 local_144;
  value_type *local_140;
  int local_138;
  undefined4 local_134;
  reference local_130;
  int local_128;
  undefined4 local_124;
  reference local_120;
  int local_118;
  undefined4 local_114;
  reference local_110;
  int local_108;
  undefined4 local_104;
  reference local_100;
  int local_f8;
  undefined4 local_f4;
  reference local_f0;
  int local_e8;
  undefined4 local_e4;
  reference local_e0;
  int local_d8;
  undefined4 local_d4;
  reference local_d0;
  int local_c8;
  undefined4 local_c4;
  reference local_c0;
  int local_b8;
  undefined4 local_b4;
  reference local_b0;
  int local_a8;
  undefined4 local_a4;
  reference local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_30;
  void *local_20;
  void *local_10;
  
  local_340 = in_RCX;
  local_338 = in_RDX;
  local_330 = in_RSI;
  if ((*(byte *)(in_RSI + 1) & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xe));
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x19cc42);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               (allocator_type *)in_stack_fffffffffffff970);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x19cc6e);
    for (local_478 = (int *)0x0; piVar1 = local_478,
        piVar6 = (int *)std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)(local_330 + 0xe)),
        piVar1 < piVar6; local_478 = (int *)((long)local_478 + 1)) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_330 + 0xe),
                          (size_type)local_478);
      local_47c = *pvVar3;
      local_488 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_338,(long)local_47c);
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (&local_468,(size_type)local_478);
      local_b0 = pvVar5;
      if (pvVar5->refcount != (int *)0x0) {
        piVar6 = pvVar5->refcount;
        local_b4 = 0xffffffff;
        LOCK();
        local_b8 = *piVar6;
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (local_b8 == 1) {
          if (pvVar5->allocator == (Allocator *)0x0) {
            local_90 = pvVar5->data;
            if (local_90 != (void *)0x0) {
              free(local_90);
            }
          }
          else {
            (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
          }
        }
      }
      pvVar5->data = (void *)0x0;
      pvVar5->elemsize = 0;
      pvVar5->elempack = 0;
      pvVar5->dims = 0;
      pvVar5->w = 0;
      pvVar5->h = 0;
      pvVar5->d = 0;
      pvVar5->c = 0;
      pvVar5->cstep = 0;
      pvVar5->refcount = (int *)0x0;
      if ((((*local_340 & 1) != 0) && ((*(byte *)((long)local_330 + 9) & 1) != 0)) &&
         (*local_488->refcount != 1)) {
        Mat::clone(&local_4d0,(__fn *)local_488,*(void **)(local_340 + 8),(int)piVar6,in_R8);
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_468,(size_type)local_478);
        local_2a0 = &local_4d0;
        local_298 = pvVar5;
        if (pvVar5 != local_2a0) {
          if (local_4d0.refcount != (int *)0x0) {
            local_2a4 = 1;
            LOCK();
            local_2a8 = *local_4d0.refcount;
            *local_4d0.refcount = *local_4d0.refcount + 1;
            UNLOCK();
          }
          local_100 = pvVar5;
          if (pvVar5->refcount != (int *)0x0) {
            piVar6 = pvVar5->refcount;
            local_104 = 0xffffffff;
            LOCK();
            local_108 = *piVar6;
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (local_108 == 1) {
              if (pvVar5->allocator == (Allocator *)0x0) {
                local_68 = pvVar5->data;
                if (local_68 != (void *)0x0) {
                  free(local_68);
                }
              }
              else {
                (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
              }
            }
          }
          pvVar5->data = (void *)0x0;
          pvVar5->elemsize = 0;
          pvVar5->elempack = 0;
          pvVar5->dims = 0;
          pvVar5->w = 0;
          pvVar5->h = 0;
          pvVar5->d = 0;
          pvVar5->c = 0;
          pvVar5->cstep = 0;
          pvVar5->refcount = (int *)0x0;
          pvVar5->data = local_2a0->data;
          pvVar5->refcount = local_2a0->refcount;
          pvVar5->elemsize = local_2a0->elemsize;
          pvVar5->elempack = local_2a0->elempack;
          pvVar5->allocator = local_2a0->allocator;
          pvVar5->dims = local_2a0->dims;
          pvVar5->w = local_2a0->w;
          pvVar5->h = local_2a0->h;
          pvVar5->d = local_2a0->d;
          pvVar5->c = local_2a0->c;
          pvVar5->cstep = local_2a0->cstep;
        }
        local_1d8 = &local_4d0;
        local_290 = pvVar5;
        local_1b0 = local_1d8;
        if (local_4d0.refcount != (int *)0x0) {
          local_1b4 = 0xffffffff;
          LOCK();
          local_1b8 = *local_4d0.refcount;
          *local_4d0.refcount = *local_4d0.refcount + -1;
          UNLOCK();
          if (local_1b8 == 1) {
            if (local_4d0.allocator == (Allocator *)0x0) {
              local_10 = local_4d0.data;
              if (local_4d0.data != (void *)0x0) {
                free(local_4d0.data);
              }
            }
            else {
              (*(local_4d0.allocator)->_vptr_Allocator[3])(local_4d0.allocator,local_4d0.data);
            }
          }
        }
        local_4d0.data = (void *)0x0;
        local_4d0.elemsize = 0;
        local_4d0.elempack = 0;
        local_4d0.dims = 0;
        local_4d0.w = 0;
        local_4d0.h = 0;
        local_4d0.d = 0;
        local_4d0.c = 0;
        local_4d0.cstep = 0;
        local_4d0.refcount = (int *)0x0;
      }
      pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (&local_468,(size_type)local_478);
      pvVar5 = local_488;
      pvVar4 = local_2b0;
      if (pvVar7->dims == 0) {
        pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_468,(size_type)local_478);
        local_2c0 = pvVar5;
        local_2b8 = pvVar4;
        if (pvVar4 != pvVar5) {
          if (pvVar5->refcount != (int *)0x0) {
            piVar6 = pvVar5->refcount;
            local_2c4 = 1;
            LOCK();
            local_2c8 = *piVar6;
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          local_f0 = pvVar4;
          if (pvVar4->refcount != (int *)0x0) {
            piVar6 = pvVar4->refcount;
            local_f4 = 0xffffffff;
            LOCK();
            local_f8 = *piVar6;
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (local_f8 == 1) {
              if (pvVar4->allocator == (Allocator *)0x0) {
                local_70 = pvVar4->data;
                if (local_70 != (void *)0x0) {
                  free(local_70);
                }
              }
              else {
                (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
              }
            }
          }
          pvVar4->data = (void *)0x0;
          pvVar4->elemsize = 0;
          pvVar4->elempack = 0;
          pvVar4->dims = 0;
          pvVar4->w = 0;
          pvVar4->h = 0;
          pvVar4->d = 0;
          pvVar4->c = 0;
          pvVar4->cstep = 0;
          pvVar4->refcount = (int *)0x0;
          pvVar4->data = local_2c0->data;
          pvVar4->refcount = local_2c0->refcount;
          pvVar4->elemsize = local_2c0->elemsize;
          pvVar4->elempack = local_2c0->elempack;
          pvVar4->allocator = local_2c0->allocator;
          pvVar4->dims = local_2c0->dims;
          pvVar4->w = local_2c0->w;
          pvVar4->h = local_2c0->h;
          pvVar4->d = local_2c0->d;
          pvVar4->c = local_2c0->c;
          pvVar4->cstep = local_2c0->cstep;
        }
      }
      local_2b0 = pvVar4;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                (&local_468,(size_type)local_478);
      convert_layout(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                     (Option *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    }
    if (((*local_340 & 1) == 0) || ((*(byte *)((long)local_330 + 9) & 1) == 0)) {
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(local_330 + 0x11));
      std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x19d99c);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                 (allocator_type *)in_stack_fffffffffffff970);
      std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x19d9c2);
      iVar2 = (**(code **)(*local_330 + 0x30))
                        (local_330,&local_468,&stack0xfffffffffffffaf8,local_340);
      if (iVar2 == 0) {
        for (local_518 = 0;
            sVar8 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(local_330 + 0x11)),
            local_518 < sVar8; local_518 = local_518 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_330 + 0x11),local_518);
          iVar2 = *pvVar3;
          pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                              &stack0xfffffffffffffaf8,local_518);
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_338,(long)iVar2);
          local_300 = pvVar4;
          local_2f8 = pvVar5;
          if (pvVar5 != pvVar4) {
            if (pvVar4->refcount != (int *)0x0) {
              piVar6 = pvVar4->refcount;
              local_304 = 1;
              LOCK();
              local_308 = *piVar6;
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            pvVar4 = pvVar5;
            local_d0 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_d4 = 0xffffffff;
              LOCK();
              local_d8 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_d8 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_80 = pvVar5->data;
                  if (local_80 != (void *)0x0) {
                    free(local_80);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
            pvVar4->data = local_300->data;
            pvVar4->refcount = local_300->refcount;
            pvVar4->elemsize = local_300->elemsize;
            pvVar4->elempack = local_300->elempack;
            pvVar4->allocator = local_300->allocator;
            pvVar4->dims = local_300->dims;
            pvVar4->w = local_300->w;
            pvVar4->h = local_300->h;
            pvVar4->d = local_300->d;
            pvVar4->c = local_300->c;
            pvVar4->cstep = local_300->cstep;
            in_stack_fffffffffffff970 = pvVar5;
            pvVar5 = pvVar4;
          }
          local_2f0 = pvVar5;
        }
        local_400 = 0;
      }
      else {
        local_400 = 1;
        local_31c = iVar2;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff970);
      if (local_400 == 0) goto LAB_0019dd64;
    }
    else {
      iVar2 = (**(code **)(*local_330 + 0x40))(local_330,&local_468,local_340);
      if (iVar2 == 0) {
        for (local_4e8 = 0;
            sVar8 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(local_330 + 0x11)),
            local_4e8 < sVar8; local_4e8 = local_4e8 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_330 + 0x11),local_4e8);
          iVar2 = *pvVar3;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (&local_468,local_4e8);
          pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_338,(long)iVar2);
          local_2e0 = pvVar5;
          local_2d8 = pvVar4;
          if (pvVar4 != pvVar5) {
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_2e4 = 1;
              LOCK();
              local_2e8 = *piVar6;
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            local_e0 = pvVar4;
            if (pvVar4->refcount != (int *)0x0) {
              piVar6 = pvVar4->refcount;
              local_e4 = 0xffffffff;
              LOCK();
              local_e8 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_e8 == 1) {
                if (pvVar4->allocator == (Allocator *)0x0) {
                  local_78 = pvVar4->data;
                  if (local_78 != (void *)0x0) {
                    free(local_78);
                  }
                }
                else {
                  (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
                }
              }
            }
            pvVar4->data = (void *)0x0;
            pvVar4->elemsize = 0;
            pvVar4->elempack = 0;
            pvVar4->dims = 0;
            pvVar4->w = 0;
            pvVar4->h = 0;
            pvVar4->d = 0;
            pvVar4->c = 0;
            pvVar4->cstep = 0;
            pvVar4->refcount = (int *)0x0;
            pvVar4->data = local_2e0->data;
            pvVar4->refcount = local_2e0->refcount;
            pvVar4->elemsize = local_2e0->elemsize;
            pvVar4->elempack = local_2e0->elempack;
            pvVar4->allocator = local_2e0->allocator;
            pvVar4->dims = local_2e0->dims;
            pvVar4->w = local_2e0->w;
            pvVar4->h = local_2e0->h;
            pvVar4->d = local_2e0->d;
            pvVar4->c = local_2e0->c;
            pvVar4->cstep = local_2e0->cstep;
          }
          local_2d0 = pvVar4;
        }
LAB_0019dd64:
        if ((*local_340 & 1) != 0) {
          for (local_528 = 0;
              sVar8 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)(local_330 + 0xe)),
              local_528 < sVar8; local_528 = local_528 + 1) {
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_330 + 0xe),local_528);
            pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_338,(long)*pvVar3);
            local_c0 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_c4 = 0xffffffff;
              LOCK();
              local_c8 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_c8 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_88 = pvVar5->data;
                  if (local_88 != (void *)0x0) {
                    free(local_88);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
          }
        }
        local_400 = 0;
      }
      else {
        local_400 = 1;
        local_31c = iVar2;
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff970);
    goto joined_r0x0019df14;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xe),0);
  iVar2 = (int)in_RCX;
  local_344 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_330 + 0x11),0);
  local_348 = *pvVar3;
  local_350 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        (local_338,(long)local_344);
  local_318 = &local_398;
  local_398.data = (void *)0x0;
  local_398.refcount = (int *)0x0;
  local_398.elemsize = 0;
  local_398.elempack = 0;
  local_398.allocator = (Allocator *)0x0;
  local_398.dims = 0;
  local_398.w = 0;
  local_398.h = 0;
  local_398.d = 0;
  local_398.c = 0;
  local_398.cstep = 0;
  if ((((*local_340 & 1) != 0) && ((*(byte *)((long)local_330 + 9) & 1) != 0)) &&
     (*local_350->refcount != 1)) {
    Mat::clone(&local_3e0,(__fn *)local_350,*(void **)(local_340 + 8),iVar2,in_R8);
    local_220 = &local_3e0;
    local_218 = &local_398;
    if (&local_398 != local_220) {
      if (local_3e0.refcount != (int *)0x0) {
        local_224 = 1;
        LOCK();
        local_228 = *local_3e0.refcount;
        *local_3e0.refcount = *local_3e0.refcount + 1;
        UNLOCK();
      }
      local_140 = &local_398;
      if (local_398.refcount != (int *)0x0) {
        local_144 = 0xffffffff;
        LOCK();
        local_148 = *local_398.refcount;
        *local_398.refcount = *local_398.refcount + -1;
        UNLOCK();
        if (local_148 == 1) {
          if (local_398.allocator == (Allocator *)0x0) {
            local_48 = local_398.data;
            if (local_398.data != (void *)0x0) {
              free(local_398.data);
            }
          }
          else {
            (*(local_398.allocator)->_vptr_Allocator[3])(local_398.allocator,local_398.data);
          }
        }
      }
      local_398.data = (void *)0x0;
      local_398.elemsize = 0;
      local_398.elempack = 0;
      local_398.w = 0;
      local_398.h = 0;
      local_398.d = 0;
      local_398.c = 0;
      local_398.cstep = 0;
      local_398.refcount = (int *)0x0;
      local_398.data = local_220->data;
      local_398.refcount = local_220->refcount;
      local_398.elemsize = local_220->elemsize;
      local_398.elempack = local_220->elempack;
      local_398.allocator = local_220->allocator;
      local_398.dims = local_220->dims;
      local_398.w = local_220->w;
      local_398.h = local_220->h;
      local_398.d = local_220->d;
      local_398.c = local_220->c;
      local_398.cstep = local_220->cstep;
    }
    local_208 = &local_3e0;
    local_210 = &local_398;
    local_150 = local_208;
    if (local_3e0.refcount != (int *)0x0) {
      local_154 = 0xffffffff;
      LOCK();
      local_158 = *local_3e0.refcount;
      *local_3e0.refcount = *local_3e0.refcount + -1;
      UNLOCK();
      if (local_158 == 1) {
        if (local_3e0.allocator == (Allocator *)0x0) {
          if (local_3e0.data != (void *)0x0) {
            free(local_3e0.data);
          }
        }
        else {
          (*(local_3e0.allocator)->_vptr_Allocator[3])(local_3e0.allocator,local_3e0.data);
        }
      }
    }
    local_3e0.data = (void *)0x0;
    local_3e0.elemsize = 0;
    local_3e0.elempack = 0;
    local_3e0.dims = 0;
    local_3e0.w = 0;
    local_3e0.h = 0;
    local_3e0.d = 0;
    local_3e0.c = 0;
    local_3e0.cstep = 0;
    local_3e0.refcount = (int *)0x0;
  }
  if (local_398.dims == 0) {
    local_240 = local_350;
    local_238 = &local_398;
    local_230 = &local_398;
    if (&local_398 != local_350) {
      if (local_350->refcount != (int *)0x0) {
        piVar6 = local_350->refcount;
        local_244 = 1;
        LOCK();
        local_248 = *piVar6;
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_130 = &local_398;
      if (local_398.refcount != (int *)0x0) {
        local_134 = 0xffffffff;
        LOCK();
        local_138 = *local_398.refcount;
        *local_398.refcount = *local_398.refcount + -1;
        UNLOCK();
        if (local_138 == 1) {
          if (local_398.allocator == (Allocator *)0x0) {
            local_50 = local_398.data;
            if (local_398.data != (void *)0x0) {
              free(local_398.data);
            }
          }
          else {
            (*(local_398.allocator)->_vptr_Allocator[3])(local_398.allocator,local_398.data);
          }
        }
      }
      local_398.data = local_240->data;
      local_398.refcount = local_240->refcount;
      local_398.elemsize = local_240->elemsize;
      local_398.elempack = local_240->elempack;
      local_398.allocator = local_240->allocator;
      local_398.w = local_240->w;
      local_398.h = local_240->h;
      local_398.d = local_240->d;
      local_398.c = local_240->c;
      local_398.cstep = local_240->cstep;
    }
  }
  convert_layout(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                 (Option *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  if (((*local_340 & 1) == 0) || ((*(byte *)((long)local_330 + 9) & 1) == 0)) {
    local_310 = &local_448;
    local_448.data = (void *)0x0;
    local_448.refcount = (int *)0x0;
    local_448.elemsize = 0;
    local_448.elempack = 0;
    local_448.allocator = (Allocator *)0x0;
    local_448.dims = 0;
    local_448.w = 0;
    local_448.h = 0;
    local_448.d = 0;
    local_448.c = 0;
    local_448.cstep = 0;
    local_44c = (**(code **)(*local_330 + 0x38))(local_330,&local_398,&local_448,local_340);
    if (local_44c == 0) {
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (local_338,(long)local_348);
      local_280 = &local_448;
      local_278 = pvVar5;
      if (pvVar5 != local_280) {
        if (local_448.refcount != (int *)0x0) {
          local_284 = 1;
          LOCK();
          local_288 = *local_448.refcount;
          *local_448.refcount = *local_448.refcount + 1;
          UNLOCK();
        }
        local_110 = pvVar5;
        if (pvVar5->refcount != (int *)0x0) {
          piVar6 = pvVar5->refcount;
          local_114 = 0xffffffff;
          LOCK();
          local_118 = *piVar6;
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (local_118 == 1) {
            if (pvVar5->allocator == (Allocator *)0x0) {
              local_60 = pvVar5->data;
              if (local_60 != (void *)0x0) {
                free(local_60);
              }
            }
            else {
              (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
            }
          }
        }
        pvVar5->data = (void *)0x0;
        pvVar5->elemsize = 0;
        pvVar5->elempack = 0;
        pvVar5->dims = 0;
        pvVar5->w = 0;
        pvVar5->h = 0;
        pvVar5->d = 0;
        pvVar5->c = 0;
        pvVar5->cstep = 0;
        pvVar5->refcount = (int *)0x0;
        pvVar5->data = local_280->data;
        pvVar5->refcount = local_280->refcount;
        pvVar5->elemsize = local_280->elemsize;
        pvVar5->elempack = local_280->elempack;
        pvVar5->allocator = local_280->allocator;
        pvVar5->dims = local_280->dims;
        pvVar5->w = local_280->w;
        pvVar5->h = local_280->h;
        pvVar5->d = local_280->d;
        pvVar5->c = local_280->c;
        pvVar5->cstep = local_280->cstep;
      }
      local_400 = 0;
      local_270 = pvVar5;
    }
    else {
      local_400 = 1;
      local_31c = local_44c;
    }
    local_1f8 = &local_448;
    local_170 = local_1f8;
    if (local_448.refcount != (int *)0x0) {
      local_174 = 0xffffffff;
      LOCK();
      local_178 = *local_448.refcount;
      *local_448.refcount = *local_448.refcount + -1;
      UNLOCK();
      if (local_178 == 1) {
        if (local_448.allocator == (Allocator *)0x0) {
          local_30 = local_448.data;
          if (local_448.data != (void *)0x0) {
            free(local_448.data);
          }
        }
        else {
          (*(local_448.allocator)->_vptr_Allocator[3])(local_448.allocator,local_448.data);
        }
      }
    }
    local_448.data = (void *)0x0;
    local_448.elemsize = 0;
    local_448.elempack = 0;
    local_448.dims = 0;
    local_448.w = 0;
    local_448.h = 0;
    local_448.d = 0;
    local_448.c = 0;
    local_448.cstep = 0;
    local_448.refcount = (int *)0x0;
    if (local_400 == 0) goto LAB_0019c87e;
  }
  else {
    local_3f8 = &local_398;
    local_3fc = (**(code **)(*local_330 + 0x48))(local_330,local_3f8,local_340);
    pvVar5 = local_3f8;
    if (local_3fc == 0) {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (local_338,(long)local_348);
      local_260 = pvVar5;
      local_258 = pvVar4;
      local_250 = pvVar4;
      if (pvVar4 != pvVar5) {
        if (pvVar5->refcount != (int *)0x0) {
          piVar6 = pvVar5->refcount;
          local_264 = 1;
          LOCK();
          local_268 = *piVar6;
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        local_120 = pvVar4;
        if (pvVar4->refcount != (int *)0x0) {
          piVar6 = pvVar4->refcount;
          local_124 = 0xffffffff;
          LOCK();
          local_128 = *piVar6;
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (local_128 == 1) {
            if (pvVar4->allocator == (Allocator *)0x0) {
              local_58 = pvVar4->data;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
            }
          }
        }
        pvVar4->data = (void *)0x0;
        pvVar4->elemsize = 0;
        pvVar4->elempack = 0;
        pvVar4->dims = 0;
        pvVar4->w = 0;
        pvVar4->h = 0;
        pvVar4->d = 0;
        pvVar4->c = 0;
        pvVar4->cstep = 0;
        pvVar4->refcount = (int *)0x0;
        pvVar4->data = local_260->data;
        pvVar4->refcount = local_260->refcount;
        pvVar4->elemsize = local_260->elemsize;
        pvVar4->elempack = local_260->elempack;
        pvVar4->allocator = local_260->allocator;
        pvVar4->dims = local_260->dims;
        pvVar4->w = local_260->w;
        pvVar4->h = local_260->h;
        pvVar4->d = local_260->d;
        pvVar4->c = local_260->c;
        pvVar4->cstep = local_260->cstep;
      }
LAB_0019c87e:
      if ((*local_340 & 1) != 0) {
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (local_338,(long)local_344);
        local_a0 = pvVar5;
        if (pvVar5->refcount != (int *)0x0) {
          piVar6 = pvVar5->refcount;
          local_a4 = 0xffffffff;
          LOCK();
          local_a8 = *piVar6;
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (local_a8 == 1) {
            if (pvVar5->allocator == (Allocator *)0x0) {
              local_98 = pvVar5->data;
              if (local_98 != (void *)0x0) {
                free(local_98);
              }
            }
            else {
              (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
            }
          }
        }
        pvVar5->data = (void *)0x0;
        pvVar5->elemsize = 0;
        pvVar5->elempack = 0;
        pvVar5->dims = 0;
        pvVar5->w = 0;
        pvVar5->h = 0;
        pvVar5->d = 0;
        pvVar5->c = 0;
        pvVar5->cstep = 0;
        pvVar5->refcount = (int *)0x0;
      }
      local_400 = 0;
    }
    else {
      local_400 = 1;
      local_31c = local_3fc;
    }
  }
  local_1e8 = &local_398;
  if (local_398.refcount != (int *)0x0) {
    local_194 = 0xffffffff;
    LOCK();
    local_198 = *local_398.refcount;
    *local_398.refcount = *local_398.refcount + -1;
    UNLOCK();
    if (local_198 == 1) {
      local_190 = local_1e8;
      if (local_398.allocator == (Allocator *)0x0) {
        local_20 = local_398.data;
        if (local_398.data != (void *)0x0) {
          free(local_398.data);
        }
      }
      else {
        (*(local_398.allocator)->_vptr_Allocator[3])(local_398.allocator,local_398.data);
      }
    }
  }
joined_r0x0019df14:
  if (local_400 == 0) {
    local_31c = 0;
  }
  return local_31c;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        if (opt.lightmode)
        {
            for (size_t i = 0; i < layer->bottoms.size(); i++)
            {
                int bottom_blob_index = layer->bottoms[i];

                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}